

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.hpp
# Opt level: O2

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::iSWAP<std::complex<double>_>::matrix(iSWAP<std::complex<double>_> *this)

{
  undefined8 *puVar1;
  long lVar2;
  data_type extraout_RDX;
  SquareMatrix<std::complex<double>_> SVar3;
  
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)0x4;
  dense::alloc_unique_array<std::complex<double>>((dense *)&this->qubits_,0x10);
  puVar1 = *(undefined8 **)(this->qubits_)._M_elems;
  *puVar1 = 0x3ff0000000000000;
  puVar1[1] = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0x10) = 0;
  *(undefined8 *)(lVar2 + 0x18) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0x20) = 0;
  *(undefined8 *)(lVar2 + 0x28) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0x30) = 0;
  *(undefined8 *)(lVar2 + 0x38) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0x40) = 0;
  *(undefined8 *)(lVar2 + 0x48) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0x50) = 0;
  *(undefined8 *)(lVar2 + 0x58) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined4 *)(lVar2 + 0x60) = 0;
  *(undefined4 *)(lVar2 + 100) = 0;
  *(undefined4 *)(lVar2 + 0x68) = 0;
  *(undefined4 *)(lVar2 + 0x6c) = 0x3ff00000;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0x70) = 0;
  *(undefined8 *)(lVar2 + 0x78) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0x80) = 0;
  *(undefined8 *)(lVar2 + 0x88) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined4 *)(lVar2 + 0x90) = 0;
  *(undefined4 *)(lVar2 + 0x94) = 0;
  *(undefined4 *)(lVar2 + 0x98) = 0;
  *(undefined4 *)(lVar2 + 0x9c) = 0x3ff00000;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0xa0) = 0;
  *(undefined8 *)(lVar2 + 0xa8) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0xb0) = 0;
  *(undefined8 *)(lVar2 + 0xb8) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0xc0) = 0;
  *(undefined8 *)(lVar2 + 200) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0xd0) = 0;
  *(undefined8 *)(lVar2 + 0xd8) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0xe0) = 0;
  *(undefined8 *)(lVar2 + 0xe8) = 0;
  lVar2 = *(long *)(this->qubits_)._M_elems;
  *(undefined8 *)(lVar2 + 0xf0) = 0x3ff0000000000000;
  *(undefined8 *)(lVar2 + 0xf8) = 0;
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T i(0,1) ;
          return qclab::dense::SquareMatrix< T >( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , i , 0 ,
                                                  0 , i , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
        }